

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O3

vector<YAML::Node,_std::allocator<YAML::Node>_> *
YAML::LoadAll(vector<YAML::Node,_std::allocator<YAML::Node>_> *__return_storage_ptr__,char *input)

{
  stringstream stream;
  allocator local_1b1;
  undefined1 *local_1b0 [2];
  undefined1 local_1a0 [16];
  stringstream local_190 [128];
  ios_base local_110 [264];
  
  std::__cxx11::string::string((string *)local_1b0,input,&local_1b1);
  std::__cxx11::stringstream::stringstream(local_190,(string *)local_1b0,_S_out|_S_in);
  if (local_1b0[0] != local_1a0) {
    operator_delete(local_1b0[0]);
  }
  LoadAll(__return_storage_ptr__,(istream *)local_190);
  std::__cxx11::stringstream::~stringstream(local_190);
  std::ios_base::~ios_base(local_110);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Node> LoadAll(const char* input) {
  std::stringstream stream(input);
  return LoadAll(stream);
}